

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall Clasp::SharedContext::setConcurrency(SharedContext *this,uint32 n,ResizeMode mode)

{
  Share SVar1;
  Solver *this_00;
  uint uVar2;
  Share SVar3;
  
  if (n < 2) {
    this->share_ = (Share)(((uint)this->share_ & 0xfffffc00) + 1);
  }
  else {
    this->share_ = (Share)((uint)this->share_ & 0xfffffc00 | n & 0x3ff);
    bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::reserve
              (&this->solvers_,n);
  }
  if ((mode & resize_push) == resize_reserve) {
    uVar2 = (this->solvers_).ebo_.size;
  }
  else {
    while (uVar2 = (this->solvers_).ebo_.size, uVar2 < ((uint)this->share_ & 0x3ff)) {
      pushSolver(this);
    }
  }
  while ((SVar1 = this->share_, (mode & resize_pop) != resize_reserve &&
         (((uint)SVar1 & 0x3ff) < uVar2))) {
    this_00 = (this->solvers_).ebo_.buf[uVar2 - 1];
    if (this_00 != (Solver *)0x0) {
      Solver::~Solver(this_00);
    }
    operator_delete(this_00);
    uVar2 = (this->solvers_).ebo_.size - 1;
    (this->solvers_).ebo_.size = uVar2;
  }
  if (((uint)SVar1 >> 0x16 & 1) != 0) {
    SVar3 = (Share)((uint)SVar1 | 0x700000);
    if (((uint)SVar1 & 0x3fe) == 0) {
      SVar3 = (Share)((uint)SVar1 & 0xffcfffff);
    }
    this->share_ = SVar3;
  }
  return;
}

Assistant:

void SharedContext::setConcurrency(uint32 n, ResizeMode mode) {
	if (n <= 1) { share_.count = 1; }
	else        { share_.count = n; solvers_.reserve(n); }
	while (solvers_.size() < share_.count && (mode & resize_push) != 0u) {
		pushSolver();
	}
	while (solvers_.size() > share_.count && (mode & resize_pop) != 0u) {
		delete solvers_.back();
		solvers_.pop_back();
	}
	if ((share_.shareM & ContextParams::share_auto) != 0) {
		setShareMode(ContextParams::share_auto);
	}
}